

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O2

void messages(void)

{
  int iVar1;
  char *buffer_for_strings;
  char *address;
  size_t sVar2;
  char *buffer;
  rtosc_print_options shortline;
  rtosc_arg_val_t scanned [3];
  
  iVar1 = rtosc_count_printed_arg_vals_of_msg("not beginning with a \'/\'");
  assert_int_eq(-1,iVar1,"return -1 if the message does not startwith a slash",0x1f1);
  buffer_for_strings = (char *)operator_new__(0x100);
  memset(buffer_for_strings,0x7f,0x100);
  address = (char *)operator_new__(0x100);
  memset(address,0x7f,0x100);
  iVar1 = rtosc_count_printed_arg_vals_of_msg
                    ("%this is a savefile\n/noteOn 0 0 0 % a noteOn message");
  assert_int_eq(3,iVar1,"read a /noteOn message",0x1fd);
  sVar2 = rtosc_scan_message("%this is a savefile\n/noteOn 0 0 0 % a noteOn message",address,0x100,
                             scanned,(long)iVar1,buffer_for_strings,0x100);
  assert_int_eq(0x34,(int)sVar2,"read a message and return correct length",0x203);
  assert_str_eq("/noteOn",address,"scan address correctly",0x204);
  buffer = (char *)operator_new__(0x80);
  builtin_strncpy(buffer,
                  "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f"
                  ,0x80);
  shortline.lossless = true;
  shortline.floating_point_precision = 3;
  shortline.sep = " ";
  shortline.linelength = 7;
  shortline.compress_ranges = 1;
  sVar2 = rtosc_print_message("/noteOn",scanned,(long)iVar1,buffer,0x80,&shortline,0);
  assert_str_eq("/noteOn\n    0 0\n    0",buffer,"print a message",0x20e);
  assert_int_eq(0x15,(int)sVar2,"print a message and return written number of bytes",0x211);
  operator_delete__(buffer);
  sVar2 = rtosc_scan_message("/first_param\n/second_param 123",address,0x100,scanned,0,
                             buffer_for_strings,0x100);
  assert_int_eq(0xd,(int)sVar2,"scan message without arguments",0x21a);
  operator_delete__(address);
  operator_delete__(buffer_for_strings);
  return;
}

Assistant:

void messages()
{

    int num = rtosc_count_printed_arg_vals_of_msg("not beginning with a '/'");
    assert_int_eq(-1, num, "return -1 if the message does not start"
                           "with a slash", __LINE__);

    int strbuflen = 256;
    char* strbuf = new char[strbuflen];
    memset(strbuf, 0x7f, strbuflen); /* init with rubbish */
    int msgbuflen = 256;
    char* msgbuf = new char[msgbuflen];
    memset(msgbuf, 0x7f, msgbuflen); /* init with rubbish */
    const char* input = "%this is a savefile\n"
                        "/noteOn 0 0 0 % a noteOn message";

    num = rtosc_count_printed_arg_vals_of_msg(input);
    assert_int_eq(3, num, "read a /noteOn message", __LINE__);
    rtosc_arg_val_t scanned[3];
    size_t rd = rtosc_scan_message(input, msgbuf, msgbuflen,
                                   scanned, num,
                                   strbuf, strbuflen);
    assert_int_eq(strlen(input), rd,
                  "read a message and return correct length", __LINE__);
    assert_str_eq("/noteOn", msgbuf, "scan address correctly", __LINE__);

    size_t len = 128;
    char* printed = new char[len];
    memset(printed, 0x7f, len); /* init with rubbish */
    auto shortline = make_print_options(true, 3, " ", 7, true);
    size_t written = rtosc_print_message("/noteOn", scanned, num,
                                         printed, len, &shortline, 0);

    const char* exp = "/noteOn\n    0 0\n    0";
    assert_str_eq(exp, printed, "print a message", __LINE__);
    assert_int_eq(strlen(exp), written,
                  "print a message and return written number of bytes",
                  __LINE__);
    delete[] printed;

    // scan message that has no parameters
    // => a following argument is not considered as an argument of
    //    the first message
    rd = rtosc_scan_message("/first_param\n"
                            "/second_param 123", msgbuf, msgbuflen,
                            scanned, 0, strbuf, strbuflen);
    assert_int_eq(13, rd, "scan message without arguments", __LINE__);
    delete[] msgbuf;
    delete[] strbuf;
}